

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader-test.cc
# Opt level: O2

void __thiscall NLProblemBuilderTest_Forward_Test::TestBody(NLProblemBuilderTest_Forward_Test *this)

{
  MockSpec<TestSuffixHandler<0>_(fmt::BasicStringRef<char>,_int,_int)> *this_00;
  TypedExpectation<TestSuffixHandler<0>_(fmt::BasicStringRef<char>,_int,_int)> *this_01;
  MockSpec<TestSuffixHandler<1>_(fmt::BasicStringRef<char>,_mp::suf::Kind,_int)> *this_02;
  TypedExpectation<TestSuffixHandler<1>_(fmt::BasicStringRef<char>,_mp::suf::Kind,_int)> *this_03;
  MockSpec<BasicTestExpr<1>_(double)> *this_04;
  TypedExpectation<BasicTestExpr<1>_(double)> *this_05;
  MockSpec<TestReference_(int)> *pMVar1;
  TypedExpectation<TestReference_(int)> *pTVar2;
  MockSpec<BasicTestExpr<1>_(mp::expr::Kind,_BasicTestExpr<1>)> *this_06;
  TypedExpectation<BasicTestExpr<1>_(mp::expr::Kind,_BasicTestExpr<1>)> *this_07;
  MockSpec<BasicTestExpr<1>_(mp::expr::Kind,_BasicTestExpr<1>,_BasicTestExpr<1>)> *this_08;
  TypedExpectation<BasicTestExpr<1>_(mp::expr::Kind,_BasicTestExpr<1>,_BasicTestExpr<1>)> *this_09;
  MockSpec<BasicTestExpr<1>_(BasicTestExpr<2>,_BasicTestExpr<1>,_BasicTestExpr<1>)> *this_10;
  TypedExpectation<BasicTestExpr<1>_(BasicTestExpr<2>,_BasicTestExpr<1>,_BasicTestExpr<1>)> *this_11
  ;
  MockSpec<TestPLTermBuilder_(int)> *this_12;
  TypedExpectation<TestPLTermBuilder_(int)> *this_13;
  MockSpec<BasicTestExpr<1>_(TestPLTermBuilder,_BasicTestExpr<1>)> *this_14;
  TypedExpectation<BasicTestExpr<1>_(TestPLTermBuilder,_BasicTestExpr<1>)> *this_15;
  MockSpec<TestExprBuilder<1,_BasicTestExpr<1>_>_(mp::expr::Kind,_int)> *this_16;
  TypedExpectation<TestExprBuilder<1,_BasicTestExpr<1>_>_(mp::expr::Kind,_int)> *this_17;
  MockSpec<BasicTestExpr<1>_(TestExprBuilder<1,_BasicTestExpr<1>_>)> *pMVar3;
  TypedExpectation<BasicTestExpr<1>_(TestExprBuilder<1,_BasicTestExpr<1>_>)> *pTVar4;
  MockSpec<TestExprBuilder<1,_BasicTestExpr<1>_>_(int)> *this_18;
  TypedExpectation<TestExprBuilder<1,_BasicTestExpr<1>_>_(int)> *this_19;
  MockSpec<TestExprBuilder<2,_BasicTestExpr<1>_>_(int,_BasicTestExpr<1>)> *this_20;
  TypedExpectation<TestExprBuilder<2,_BasicTestExpr<1>_>_(int,_BasicTestExpr<1>)> *this_21;
  MockSpec<BasicTestExpr<1>_(TestExprBuilder<2,_BasicTestExpr<1>_>)> *this_22;
  TypedExpectation<BasicTestExpr<1>_(TestExprBuilder<2,_BasicTestExpr<1>_>)> *this_23;
  MockSpec<TestExprBuilder<0,_BasicTestExpr<0>_>_(int,_BasicTestExpr<0>)> *this_24;
  TypedExpectation<TestExprBuilder<0,_BasicTestExpr<0>_>_(int,_BasicTestExpr<0>)> *this_25;
  MockSpec<BasicTestExpr<1>_(TestExprBuilder<0,_BasicTestExpr<0>_>)> *this_26;
  TypedExpectation<BasicTestExpr<1>_(TestExprBuilder<0,_BasicTestExpr<0>_>)> *this_27;
  MockSpec<TestExprBuilder<3,_BasicTestExpr<2>_>_(int)> *this_28;
  TypedExpectation<TestExprBuilder<3,_BasicTestExpr<2>_>_(int)> *this_29;
  MockSpec<TestCountExpr_(TestExprBuilder<3,_BasicTestExpr<2>_>)> *this_30;
  TypedExpectation<TestCountExpr_(TestExprBuilder<3,_BasicTestExpr<2>_>)> *this_31;
  MockSpec<BasicTestExpr<2>_(bool)> *this_32;
  TypedExpectation<BasicTestExpr<2>_(bool)> *this_33;
  MockSpec<BasicTestExpr<2>_(BasicTestExpr<2>)> *this_34;
  TypedExpectation<BasicTestExpr<2>_(BasicTestExpr<2>)> *this_35;
  MockSpec<BasicTestExpr<2>_(mp::expr::Kind,_BasicTestExpr<2>,_BasicTestExpr<2>)> *this_36;
  TypedExpectation<BasicTestExpr<2>_(mp::expr::Kind,_BasicTestExpr<2>,_BasicTestExpr<2>)> *this_37;
  MockSpec<BasicTestExpr<2>_(mp::expr::Kind,_BasicTestExpr<1>,_BasicTestExpr<1>)> *this_38;
  TypedExpectation<BasicTestExpr<2>_(mp::expr::Kind,_BasicTestExpr<1>,_BasicTestExpr<1>)> *this_39;
  MockSpec<BasicTestExpr<2>_(mp::expr::Kind,_BasicTestExpr<1>,_TestCountExpr)> *this_40;
  TypedExpectation<BasicTestExpr<2>_(mp::expr::Kind,_BasicTestExpr<1>,_TestCountExpr)> *this_41;
  MockSpec<BasicTestExpr<2>_(BasicTestExpr<2>,_BasicTestExpr<2>,_BasicTestExpr<2>)> *this_42;
  TypedExpectation<BasicTestExpr<2>_(BasicTestExpr<2>,_BasicTestExpr<2>,_BasicTestExpr<2>)> *this_43
  ;
  MockSpec<TestExprBuilder<4,_BasicTestExpr<2>_>_(mp::expr::Kind,_int)> *this_44;
  TypedExpectation<TestExprBuilder<4,_BasicTestExpr<2>_>_(mp::expr::Kind,_int)> *this_45;
  MockSpec<BasicTestExpr<2>_(TestExprBuilder<4,_BasicTestExpr<2>_>)> *this_46;
  TypedExpectation<BasicTestExpr<2>_(TestExprBuilder<4,_BasicTestExpr<2>_>)> *this_47;
  MockSpec<TestExprBuilder<5,_BasicTestExpr<1>_>_(mp::expr::Kind,_int)> *this_48;
  TypedExpectation<TestExprBuilder<5,_BasicTestExpr<1>_>_(mp::expr::Kind,_int)> *this_49;
  MockSpec<BasicTestExpr<2>_(TestExprBuilder<5,_BasicTestExpr<1>_>)> *this_50;
  TypedExpectation<BasicTestExpr<2>_(TestExprBuilder<5,_BasicTestExpr<1>_>)> *this_51;
  MockSpec<BasicTestExpr<0>_(fmt::BasicStringRef<char>)> *this_52;
  TypedExpectation<BasicTestExpr<0>_(fmt::BasicStringRef<char>)> *this_53;
  MockSpec<BasicTestExpr<0>_(BasicTestExpr<2>,_BasicTestExpr<0>,_BasicTestExpr<0>)> *this_54;
  TypedExpectation<BasicTestExpr<0>_(BasicTestExpr<2>,_BasicTestExpr<0>,_BasicTestExpr<0>)> *this_55
  ;
  BasicStringRef<char> value;
  Argument1 gmock_a1;
  BasicStringRef<char> value_00;
  Argument1 gmock_a1_00;
  BasicStringRef<char> value_01;
  Argument1 gmock_a1_01;
  MatcherBase<int> MStack_1cc8;
  MatcherBase<fmt::BasicStringRef<char>_> local_1cb0;
  MatcherBase<int> local_1c98;
  linked_ptr<testing::ActionInterface<TestSuffixHandler<0>_(fmt::BasicStringRef<char>,_int,_int)>_>
  local_1c80;
  undefined4 local_1c6c;
  StrictMock<MockProblemBuilder> builder;
  
  testing::StrictMock<MockProblemBuilder>::StrictMock(&builder);
  value.size_ = 3;
  value.data_ = "foo";
  testing::Matcher<fmt::BasicStringRef<char>_>::Matcher
            ((Matcher<fmt::BasicStringRef<char>_> *)&local_1cb0,value);
  testing::Matcher<int>::Matcher((Matcher<int> *)&MStack_1cc8,2);
  testing::Matcher<int>::Matcher((Matcher<int> *)&local_1c98,0xb);
  this_00 = MockProblemBuilder::gmock_AddIntSuffix
                      (&builder.super_MockProblemBuilder,
                       (Matcher<fmt::BasicStringRef<char>_> *)&local_1cb0,
                       (Matcher<int> *)&MStack_1cc8,(Matcher<int> *)&local_1c98);
  this_01 = testing::internal::MockSpec<TestSuffixHandler<0>_(fmt::BasicStringRef<char>,_int,_int)>
            ::InternalExpectedAt
                      (this_00,
                       "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/nl-reader-test.cc"
                       ,0x6b8,"builder","AddIntSuffix (str, mp::suf::OBJ, 11)");
  local_1c6c = 0x2a;
  testing::internal::ReturnAction::operator_cast_to_Action((ReturnAction *)&local_1c80);
  testing::internal::TypedExpectation<TestSuffixHandler<0>_(fmt::BasicStringRef<char>,_int,_int)>::
  WillOnce(this_01,(Action<TestSuffixHandler<0>_(fmt::BasicStringRef<char>,_int,_int)> *)&local_1c80
          );
  testing::internal::
  linked_ptr<testing::ActionInterface<TestSuffixHandler<0>_(fmt::BasicStringRef<char>,_int,_int)>_>
  ::~linked_ptr(&local_1c80);
  testing::internal::MatcherBase<int>::~MatcherBase(&local_1c98);
  testing::internal::MatcherBase<int>::~MatcherBase(&MStack_1cc8);
  testing::internal::MatcherBase<fmt::BasicStringRef<char>_>::~MatcherBase(&local_1cb0);
  gmock_a1.size_ = 3;
  gmock_a1.data_ = "foo";
  MockProblemBuilder::AddIntSuffix(&builder.super_MockProblemBuilder,gmock_a1,2,0xb);
  testing::StrictMock<MockProblemBuilder>::~StrictMock(&builder);
  testing::StrictMock<MockProblemBuilder>::StrictMock(&builder);
  value_00.size_ = 3;
  value_00.data_ = "foo";
  testing::Matcher<fmt::BasicStringRef<char>_>::Matcher
            ((Matcher<fmt::BasicStringRef<char>_> *)&local_1cb0,value_00);
  testing::Matcher<mp::suf::Kind>::Matcher((Matcher<mp::suf::Kind> *)&MStack_1cc8,OBJ);
  testing::Matcher<int>::Matcher((Matcher<int> *)&local_1c98,0xb);
  this_02 = MockProblemBuilder::gmock_AddDblSuffix
                      (&builder.super_MockProblemBuilder,
                       (Matcher<fmt::BasicStringRef<char>_> *)&local_1cb0,
                       (Matcher<mp::suf::Kind> *)&MStack_1cc8,(Matcher<int> *)&local_1c98);
  this_03 = testing::internal::
            MockSpec<TestSuffixHandler<1>_(fmt::BasicStringRef<char>,_mp::suf::Kind,_int)>::
            InternalExpectedAt(this_02,
                               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/nl-reader-test.cc"
                               ,0x6ba,"builder","AddDblSuffix (str, mp::suf::OBJ, 11)");
  local_1c6c = 0x2a;
  testing::internal::ReturnAction::operator_cast_to_Action((ReturnAction *)&local_1c80);
  testing::internal::
  TypedExpectation<TestSuffixHandler<1>_(fmt::BasicStringRef<char>,_mp::suf::Kind,_int)>::WillOnce
            (this_03,(Action<TestSuffixHandler<1>_(fmt::BasicStringRef<char>,_mp::suf::Kind,_int)> *
                     )&local_1c80);
  testing::internal::
  linked_ptr<testing::ActionInterface<TestSuffixHandler<1>_(fmt::BasicStringRef<char>,_mp::suf::Kind,_int)>_>
  ::~linked_ptr((linked_ptr<testing::ActionInterface<TestSuffixHandler<1>_(fmt::BasicStringRef<char>,_mp::suf::Kind,_int)>_>
                 *)&local_1c80);
  testing::internal::MatcherBase<int>::~MatcherBase(&local_1c98);
  testing::internal::MatcherBase<mp::suf::Kind>::~MatcherBase
            ((MatcherBase<mp::suf::Kind> *)&MStack_1cc8);
  testing::internal::MatcherBase<fmt::BasicStringRef<char>_>::~MatcherBase(&local_1cb0);
  gmock_a1_00.size_ = 3;
  gmock_a1_00.data_ = "foo";
  MockProblemBuilder::AddDblSuffix(&builder.super_MockProblemBuilder,gmock_a1_00,OBJ,0xb);
  testing::StrictMock<MockProblemBuilder>::~StrictMock(&builder);
  testing::StrictMock<MockProblemBuilder>::StrictMock(&builder);
  testing::Matcher<double>::Matcher((Matcher<double> *)&local_1cb0,2.2);
  this_04 = MockProblemBuilder::gmock_MakeNumericConstant
                      (&builder.super_MockProblemBuilder,(Matcher<double> *)&local_1cb0);
  this_05 = testing::internal::MockSpec<BasicTestExpr<1>_(double)>::InternalExpectedAt
                      (this_04,
                       "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/nl-reader-test.cc"
                       ,0x6bd,"builder","MakeNumericConstant (2.2)");
  local_1c98._vptr_MatcherBase = (_func_int **)CONCAT44(local_1c98._vptr_MatcherBase._4_4_,0x2a);
  testing::internal::ReturnAction::operator_cast_to_Action((ReturnAction *)&MStack_1cc8);
  testing::internal::TypedExpectation<BasicTestExpr<1>_(double)>::WillOnce
            (this_05,(Action<BasicTestExpr<1>_(double)> *)&MStack_1cc8);
  testing::internal::linked_ptr<testing::ActionInterface<BasicTestExpr<1>_(double)>_>::~linked_ptr
            ((linked_ptr<testing::ActionInterface<BasicTestExpr<1>_(double)>_> *)&MStack_1cc8);
  testing::internal::MatcherBase<double>::~MatcherBase((MatcherBase<double> *)&local_1cb0);
  MockProblemBuilder::MakeNumericConstant(&builder.super_MockProblemBuilder,2.2);
  testing::StrictMock<MockProblemBuilder>::~StrictMock(&builder);
  testing::StrictMock<MockProblemBuilder>::StrictMock(&builder);
  testing::Matcher<int>::Matcher((Matcher<int> *)&local_1cb0,0x21);
  pMVar1 = MockProblemBuilder::gmock_MakeVariable
                     (&builder.super_MockProblemBuilder,(Matcher<int> *)&local_1cb0);
  pTVar2 = testing::internal::MockSpec<TestReference_(int)>::InternalExpectedAt
                     (pMVar1,
                      "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/nl-reader-test.cc"
                      ,0x6be,"builder","MakeVariable (33)");
  local_1c98._vptr_MatcherBase = (_func_int **)0x2a00000000;
  testing::internal::ReturnAction::operator_cast_to_Action((ReturnAction *)&MStack_1cc8);
  testing::internal::TypedExpectation<TestReference_(int)>::WillOnce
            (pTVar2,(Action<TestReference_(int)> *)&MStack_1cc8);
  testing::internal::linked_ptr<testing::ActionInterface<TestReference_(int)>_>::~linked_ptr
            ((linked_ptr<testing::ActionInterface<TestReference_(int)>_> *)&MStack_1cc8);
  testing::internal::MatcherBase<int>::~MatcherBase((MatcherBase<int> *)&local_1cb0);
  MockProblemBuilder::MakeVariable(&builder.super_MockProblemBuilder,0x21);
  testing::StrictMock<MockProblemBuilder>::~StrictMock(&builder);
  testing::StrictMock<MockProblemBuilder>::StrictMock(&builder);
  testing::Matcher<int>::Matcher((Matcher<int> *)&local_1cb0,0x21);
  pMVar1 = MockProblemBuilder::gmock_MakeCommonExpr
                     (&builder.super_MockProblemBuilder,(Matcher<int> *)&local_1cb0);
  pTVar2 = testing::internal::MockSpec<TestReference_(int)>::InternalExpectedAt
                     (pMVar1,
                      "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/nl-reader-test.cc"
                      ,0x6bf,"builder","MakeCommonExpr (33)");
  local_1c98._vptr_MatcherBase = (_func_int **)0x2a00000000;
  testing::internal::ReturnAction::operator_cast_to_Action((ReturnAction *)&MStack_1cc8);
  testing::internal::TypedExpectation<TestReference_(int)>::WillOnce
            (pTVar2,(Action<TestReference_(int)> *)&MStack_1cc8);
  testing::internal::linked_ptr<testing::ActionInterface<TestReference_(int)>_>::~linked_ptr
            ((linked_ptr<testing::ActionInterface<TestReference_(int)>_> *)&MStack_1cc8);
  testing::internal::MatcherBase<int>::~MatcherBase((MatcherBase<int> *)&local_1cb0);
  MockProblemBuilder::MakeCommonExpr(&builder.super_MockProblemBuilder,0x21);
  testing::StrictMock<MockProblemBuilder>::~StrictMock(&builder);
  testing::StrictMock<MockProblemBuilder>::StrictMock(&builder);
  testing::Matcher<mp::expr::Kind>::Matcher((Matcher<mp::expr::Kind> *)&local_1cb0,ABS);
  testing::Matcher<BasicTestExpr<1>_>::Matcher
            ((Matcher<BasicTestExpr<1>_> *)&MStack_1cc8,(BasicTestExpr<1>)0x2a);
  this_06 = MockProblemBuilder::gmock_MakeUnary
                      (&builder.super_MockProblemBuilder,(Matcher<mp::expr::Kind> *)&local_1cb0,
                       (Matcher<BasicTestExpr<1>_> *)&MStack_1cc8);
  this_07 = testing::internal::MockSpec<BasicTestExpr<1>_(mp::expr::Kind,_BasicTestExpr<1>)>::
            InternalExpectedAt(this_06,
                               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/nl-reader-test.cc"
                               ,0x6c1,"builder","MakeUnary (expr::ABS, TestNumericExpr(ID))");
  local_1c80.value_._0_4_ = 0x2b;
  testing::internal::ReturnAction::operator_cast_to_Action((ReturnAction *)&local_1c98);
  testing::internal::TypedExpectation<BasicTestExpr<1>_(mp::expr::Kind,_BasicTestExpr<1>)>::WillOnce
            (this_07,(Action<BasicTestExpr<1>_(mp::expr::Kind,_BasicTestExpr<1>)> *)&local_1c98);
  testing::internal::
  linked_ptr<testing::ActionInterface<BasicTestExpr<1>_(mp::expr::Kind,_BasicTestExpr<1>)>_>::
  ~linked_ptr((linked_ptr<testing::ActionInterface<BasicTestExpr<1>_(mp::expr::Kind,_BasicTestExpr<1>)>_>
               *)&local_1c98);
  testing::internal::MatcherBase<BasicTestExpr<1>_>::~MatcherBase
            ((MatcherBase<BasicTestExpr<1>_> *)&MStack_1cc8);
  testing::internal::MatcherBase<mp::expr::Kind>::~MatcherBase
            ((MatcherBase<mp::expr::Kind> *)&local_1cb0);
  MockProblemBuilder::MakeUnary(&builder.super_MockProblemBuilder,ABS,(Argument2)0x2a);
  testing::StrictMock<MockProblemBuilder>::~StrictMock(&builder);
  testing::StrictMock<MockProblemBuilder>::StrictMock(&builder);
  testing::Matcher<mp::expr::Kind>::Matcher((Matcher<mp::expr::Kind> *)&local_1cb0,ADD);
  testing::Matcher<BasicTestExpr<1>_>::Matcher
            ((Matcher<BasicTestExpr<1>_> *)&MStack_1cc8,(BasicTestExpr<1>)0x2a);
  testing::Matcher<BasicTestExpr<1>_>::Matcher
            ((Matcher<BasicTestExpr<1>_> *)&local_1c98,(BasicTestExpr<1>)0x2b);
  this_08 = MockProblemBuilder::gmock_MakeBinary
                      (&builder.super_MockProblemBuilder,(Matcher<mp::expr::Kind> *)&local_1cb0,
                       (Matcher<BasicTestExpr<1>_> *)&MStack_1cc8,
                       (Matcher<BasicTestExpr<1>_> *)&local_1c98);
  this_09 = testing::internal::
            MockSpec<BasicTestExpr<1>_(mp::expr::Kind,_BasicTestExpr<1>,_BasicTestExpr<1>)>::
            InternalExpectedAt(this_08,
                               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/nl-reader-test.cc"
                               ,0x6c4,"builder",
                               "MakeBinary (expr::ADD, TestNumericExpr(ID), TestNumericExpr(ID2))");
  local_1c6c = 0x2c;
  testing::internal::ReturnAction::operator_cast_to_Action((ReturnAction *)&local_1c80);
  testing::internal::
  TypedExpectation<BasicTestExpr<1>_(mp::expr::Kind,_BasicTestExpr<1>,_BasicTestExpr<1>)>::WillOnce
            (this_09,(Action<BasicTestExpr<1>_(mp::expr::Kind,_BasicTestExpr<1>,_BasicTestExpr<1>)>
                      *)&local_1c80);
  testing::internal::
  linked_ptr<testing::ActionInterface<BasicTestExpr<1>_(mp::expr::Kind,_BasicTestExpr<1>,_BasicTestExpr<1>)>_>
  ::~linked_ptr((linked_ptr<testing::ActionInterface<BasicTestExpr<1>_(mp::expr::Kind,_BasicTestExpr<1>,_BasicTestExpr<1>)>_>
                 *)&local_1c80);
  testing::internal::MatcherBase<BasicTestExpr<1>_>::~MatcherBase
            ((MatcherBase<BasicTestExpr<1>_> *)&local_1c98);
  testing::internal::MatcherBase<BasicTestExpr<1>_>::~MatcherBase
            ((MatcherBase<BasicTestExpr<1>_> *)&MStack_1cc8);
  testing::internal::MatcherBase<mp::expr::Kind>::~MatcherBase
            ((MatcherBase<mp::expr::Kind> *)&local_1cb0);
  MockProblemBuilder::MakeBinary
            (&builder.super_MockProblemBuilder,ADD,(Argument2)0x2a,(Argument3)0x2b);
  testing::StrictMock<MockProblemBuilder>::~StrictMock(&builder);
  testing::StrictMock<MockProblemBuilder>::StrictMock(&builder);
  testing::Matcher<BasicTestExpr<2>_>::Matcher
            ((Matcher<BasicTestExpr<2>_> *)&local_1cb0,(BasicTestExpr<2>)0x2a);
  testing::Matcher<BasicTestExpr<1>_>::Matcher
            ((Matcher<BasicTestExpr<1>_> *)&MStack_1cc8,(BasicTestExpr<1>)0x2b);
  testing::Matcher<BasicTestExpr<1>_>::Matcher
            ((Matcher<BasicTestExpr<1>_> *)&local_1c98,(BasicTestExpr<1>)0x2c);
  this_10 = MockProblemBuilder::gmock_MakeIf
                      (&builder.super_MockProblemBuilder,(Matcher<BasicTestExpr<2>_> *)&local_1cb0,
                       (Matcher<BasicTestExpr<1>_> *)&MStack_1cc8,
                       (Matcher<BasicTestExpr<1>_> *)&local_1c98);
  this_11 = testing::internal::
            MockSpec<BasicTestExpr<1>_(BasicTestExpr<2>,_BasicTestExpr<1>,_BasicTestExpr<1>)>::
            InternalExpectedAt(this_10,
                               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/nl-reader-test.cc"
                               ,0x6c7,"builder",
                               "MakeIf (TestLogicalExpr(ID), TestNumericExpr(ID2), TestNumericExpr(ID3))"
                              );
  local_1c6c = 0x2d;
  testing::internal::ReturnAction::operator_cast_to_Action((ReturnAction *)&local_1c80);
  testing::internal::
  TypedExpectation<BasicTestExpr<1>_(BasicTestExpr<2>,_BasicTestExpr<1>,_BasicTestExpr<1>)>::
  WillOnce(this_11,(Action<BasicTestExpr<1>_(BasicTestExpr<2>,_BasicTestExpr<1>,_BasicTestExpr<1>)>
                    *)&local_1c80);
  testing::internal::
  linked_ptr<testing::ActionInterface<BasicTestExpr<1>_(BasicTestExpr<2>,_BasicTestExpr<1>,_BasicTestExpr<1>)>_>
  ::~linked_ptr((linked_ptr<testing::ActionInterface<BasicTestExpr<1>_(BasicTestExpr<2>,_BasicTestExpr<1>,_BasicTestExpr<1>)>_>
                 *)&local_1c80);
  testing::internal::MatcherBase<BasicTestExpr<1>_>::~MatcherBase
            ((MatcherBase<BasicTestExpr<1>_> *)&local_1c98);
  testing::internal::MatcherBase<BasicTestExpr<1>_>::~MatcherBase
            ((MatcherBase<BasicTestExpr<1>_> *)&MStack_1cc8);
  testing::internal::MatcherBase<BasicTestExpr<2>_>::~MatcherBase
            ((MatcherBase<BasicTestExpr<2>_> *)&local_1cb0);
  MockProblemBuilder::MakeIf
            (&builder.super_MockProblemBuilder,(Argument1)0x2a,(Argument2)0x2b,(Argument3)0x2c);
  testing::StrictMock<MockProblemBuilder>::~StrictMock(&builder);
  testing::StrictMock<MockProblemBuilder>::StrictMock(&builder);
  testing::Matcher<int>::Matcher((Matcher<int> *)&local_1cb0,0x2c);
  this_12 = MockProblemBuilder::gmock_BeginPLTerm
                      (&builder.super_MockProblemBuilder,(Matcher<int> *)&local_1cb0);
  this_13 = testing::internal::MockSpec<TestPLTermBuilder_(int)>::InternalExpectedAt
                      (this_12,
                       "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/nl-reader-test.cc"
                       ,0x6c9,"builder","BeginPLTerm (44)");
  local_1c98._vptr_MatcherBase._0_4_ = 0x2a;
  testing::internal::ReturnAction::operator_cast_to_Action((ReturnAction *)&MStack_1cc8);
  testing::internal::TypedExpectation<TestPLTermBuilder_(int)>::WillOnce
            (this_13,(Action<TestPLTermBuilder_(int)> *)&MStack_1cc8);
  testing::internal::linked_ptr<testing::ActionInterface<TestPLTermBuilder_(int)>_>::~linked_ptr
            ((linked_ptr<testing::ActionInterface<TestPLTermBuilder_(int)>_> *)&MStack_1cc8);
  testing::internal::MatcherBase<int>::~MatcherBase((MatcherBase<int> *)&local_1cb0);
  MockProblemBuilder::BeginPLTerm(&builder.super_MockProblemBuilder,0x2c);
  testing::StrictMock<MockProblemBuilder>::~StrictMock(&builder);
  testing::StrictMock<MockProblemBuilder>::StrictMock(&builder);
  testing::Matcher<TestPLTermBuilder>::Matcher
            ((Matcher<TestPLTermBuilder> *)&local_1cb0,(TestPLTermBuilder)0x2a);
  testing::Matcher<BasicTestExpr<1>_>::Matcher
            ((Matcher<BasicTestExpr<1>_> *)&MStack_1cc8,(BasicTestExpr<1>)0x0);
  this_14 = MockProblemBuilder::gmock_EndPLTerm
                      (&builder.super_MockProblemBuilder,(Matcher<TestPLTermBuilder> *)&local_1cb0,
                       (Matcher<BasicTestExpr<1>_> *)&MStack_1cc8);
  this_15 = testing::internal::MockSpec<BasicTestExpr<1>_(TestPLTermBuilder,_BasicTestExpr<1>)>::
            InternalExpectedAt(this_14,
                               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/nl-reader-test.cc"
                               ,0x6cc,"builder",
                               "EndPLTerm (TestPLTermBuilder(ID), TestReference(ID2))");
  local_1c80.value_._0_4_ = 0x2c;
  testing::internal::ReturnAction::operator_cast_to_Action((ReturnAction *)&local_1c98);
  testing::internal::TypedExpectation<BasicTestExpr<1>_(TestPLTermBuilder,_BasicTestExpr<1>)>::
  WillOnce(this_15,(Action<BasicTestExpr<1>_(TestPLTermBuilder,_BasicTestExpr<1>)> *)&local_1c98);
  testing::internal::
  linked_ptr<testing::ActionInterface<BasicTestExpr<1>_(TestPLTermBuilder,_BasicTestExpr<1>)>_>::
  ~linked_ptr((linked_ptr<testing::ActionInterface<BasicTestExpr<1>_(TestPLTermBuilder,_BasicTestExpr<1>)>_>
               *)&local_1c98);
  testing::internal::MatcherBase<BasicTestExpr<1>_>::~MatcherBase
            ((MatcherBase<BasicTestExpr<1>_> *)&MStack_1cc8);
  testing::internal::MatcherBase<TestPLTermBuilder>::~MatcherBase
            ((MatcherBase<TestPLTermBuilder> *)&local_1cb0);
  MockProblemBuilder::EndPLTerm(&builder.super_MockProblemBuilder,(Argument1)0x2a,(Argument2)0x0);
  testing::StrictMock<MockProblemBuilder>::~StrictMock(&builder);
  testing::StrictMock<MockProblemBuilder>::StrictMock(&builder);
  testing::Matcher<mp::expr::Kind>::Matcher((Matcher<mp::expr::Kind> *)&local_1cb0,LAST_VARARG);
  testing::Matcher<int>::Matcher((Matcher<int> *)&MStack_1cc8,0x4d);
  this_16 = MockProblemBuilder::gmock_BeginIterated
                      (&builder.super_MockProblemBuilder,(Matcher<mp::expr::Kind> *)&local_1cb0,
                       (Matcher<int> *)&MStack_1cc8);
  this_17 = testing::internal::MockSpec<TestExprBuilder<1,_BasicTestExpr<1>_>_(mp::expr::Kind,_int)>
            ::InternalExpectedAt
                      (this_16,
                       "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/nl-reader-test.cc"
                       ,0x6cf,"builder","BeginIterated (expr::MAX, 77)");
  local_1c80.value_._0_4_ = 0x2a;
  testing::internal::ReturnAction::operator_cast_to_Action((ReturnAction *)&local_1c98);
  testing::internal::TypedExpectation<TestExprBuilder<1,_BasicTestExpr<1>_>_(mp::expr::Kind,_int)>::
  WillOnce(this_17,(Action<TestExprBuilder<1,_BasicTestExpr<1>_>_(mp::expr::Kind,_int)> *)
                   &local_1c98);
  testing::internal::
  linked_ptr<testing::ActionInterface<TestExprBuilder<1,_BasicTestExpr<1>_>_(mp::expr::Kind,_int)>_>
  ::~linked_ptr((linked_ptr<testing::ActionInterface<TestExprBuilder<1,_BasicTestExpr<1>_>_(mp::expr::Kind,_int)>_>
                 *)&local_1c98);
  testing::internal::MatcherBase<int>::~MatcherBase(&MStack_1cc8);
  testing::internal::MatcherBase<mp::expr::Kind>::~MatcherBase
            ((MatcherBase<mp::expr::Kind> *)&local_1cb0);
  MockProblemBuilder::BeginIterated(&builder.super_MockProblemBuilder,LAST_VARARG,0x4d);
  testing::StrictMock<MockProblemBuilder>::~StrictMock(&builder);
  testing::StrictMock<MockProblemBuilder>::StrictMock(&builder);
  testing::Matcher<TestExprBuilder<1,_BasicTestExpr<1>_>_>::Matcher
            ((Matcher<TestExprBuilder<1,_BasicTestExpr<1>_>_> *)&local_1cb0,
             (TestExprBuilder<1,_BasicTestExpr<1>_>)0x2a);
  pMVar3 = MockProblemBuilder::gmock_EndIterated
                     (&builder.super_MockProblemBuilder,
                      (Matcher<TestExprBuilder<1,_BasicTestExpr<1>_>_> *)&local_1cb0);
  pTVar4 = testing::internal::MockSpec<BasicTestExpr<1>_(TestExprBuilder<1,_BasicTestExpr<1>_>)>::
           InternalExpectedAt(pMVar3,
                              "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/nl-reader-test.cc"
                              ,0x6d1,"builder","EndIterated (TestIteratedExprBuilder(ID))");
  local_1c98._vptr_MatcherBase._0_4_ = 0x2b;
  testing::internal::ReturnAction::operator_cast_to_Action((ReturnAction *)&MStack_1cc8);
  testing::internal::TypedExpectation<BasicTestExpr<1>_(TestExprBuilder<1,_BasicTestExpr<1>_>)>::
  WillOnce(pTVar4,(Action<BasicTestExpr<1>_(TestExprBuilder<1,_BasicTestExpr<1>_>)> *)&MStack_1cc8);
  testing::internal::
  linked_ptr<testing::ActionInterface<BasicTestExpr<1>_(TestExprBuilder<1,_BasicTestExpr<1>_>)>_>::
  ~linked_ptr((linked_ptr<testing::ActionInterface<BasicTestExpr<1>_(TestExprBuilder<1,_BasicTestExpr<1>_>)>_>
               *)&MStack_1cc8);
  testing::internal::MatcherBase<TestExprBuilder<1,_BasicTestExpr<1>_>_>::~MatcherBase
            ((MatcherBase<TestExprBuilder<1,_BasicTestExpr<1>_>_> *)&local_1cb0);
  MockProblemBuilder::EndIterated(&builder.super_MockProblemBuilder,(Argument1)0x2a);
  testing::StrictMock<MockProblemBuilder>::~StrictMock(&builder);
  testing::StrictMock<MockProblemBuilder>::StrictMock(&builder);
  testing::Matcher<int>::Matcher((Matcher<int> *)&local_1cb0,0x58);
  this_18 = MockProblemBuilder::gmock_BeginSum
                      (&builder.super_MockProblemBuilder,(Matcher<int> *)&local_1cb0);
  this_19 = testing::internal::MockSpec<TestExprBuilder<1,_BasicTestExpr<1>_>_(int)>::
            InternalExpectedAt(this_18,
                               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/nl-reader-test.cc"
                               ,0x6d4,"builder","BeginSum (88)");
  local_1c98._vptr_MatcherBase._0_4_ = 0x2a;
  testing::internal::ReturnAction::operator_cast_to_Action((ReturnAction *)&MStack_1cc8);
  testing::internal::TypedExpectation<TestExprBuilder<1,_BasicTestExpr<1>_>_(int)>::WillOnce
            (this_19,(Action<TestExprBuilder<1,_BasicTestExpr<1>_>_(int)> *)&MStack_1cc8);
  testing::internal::
  linked_ptr<testing::ActionInterface<TestExprBuilder<1,_BasicTestExpr<1>_>_(int)>_>::~linked_ptr
            ((linked_ptr<testing::ActionInterface<TestExprBuilder<1,_BasicTestExpr<1>_>_(int)>_> *)
             &MStack_1cc8);
  testing::internal::MatcherBase<int>::~MatcherBase((MatcherBase<int> *)&local_1cb0);
  MockProblemBuilder::BeginSum(&builder.super_MockProblemBuilder,0x58);
  testing::StrictMock<MockProblemBuilder>::~StrictMock(&builder);
  testing::StrictMock<MockProblemBuilder>::StrictMock(&builder);
  testing::Matcher<TestExprBuilder<1,_BasicTestExpr<1>_>_>::Matcher
            ((Matcher<TestExprBuilder<1,_BasicTestExpr<1>_>_> *)&local_1cb0,
             (TestExprBuilder<1,_BasicTestExpr<1>_>)0x2a);
  pMVar3 = MockProblemBuilder::gmock_EndSum
                     (&builder.super_MockProblemBuilder,
                      (Matcher<TestExprBuilder<1,_BasicTestExpr<1>_>_> *)&local_1cb0);
  pTVar4 = testing::internal::MockSpec<BasicTestExpr<1>_(TestExprBuilder<1,_BasicTestExpr<1>_>)>::
           InternalExpectedAt(pMVar3,
                              "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/nl-reader-test.cc"
                              ,0x6d6,"builder","EndSum (TestIteratedExprBuilder(ID))");
  local_1c98._vptr_MatcherBase._0_4_ = 0x2b;
  testing::internal::ReturnAction::operator_cast_to_Action((ReturnAction *)&MStack_1cc8);
  testing::internal::TypedExpectation<BasicTestExpr<1>_(TestExprBuilder<1,_BasicTestExpr<1>_>)>::
  WillOnce(pTVar4,(Action<BasicTestExpr<1>_(TestExprBuilder<1,_BasicTestExpr<1>_>)> *)&MStack_1cc8);
  testing::internal::
  linked_ptr<testing::ActionInterface<BasicTestExpr<1>_(TestExprBuilder<1,_BasicTestExpr<1>_>)>_>::
  ~linked_ptr((linked_ptr<testing::ActionInterface<BasicTestExpr<1>_(TestExprBuilder<1,_BasicTestExpr<1>_>)>_>
               *)&MStack_1cc8);
  testing::internal::MatcherBase<TestExprBuilder<1,_BasicTestExpr<1>_>_>::~MatcherBase
            ((MatcherBase<TestExprBuilder<1,_BasicTestExpr<1>_>_> *)&local_1cb0);
  MockProblemBuilder::EndSum(&builder.super_MockProblemBuilder,(Argument1)0x2a);
  testing::StrictMock<MockProblemBuilder>::~StrictMock(&builder);
  testing::StrictMock<MockProblemBuilder>::StrictMock(&builder);
  testing::Matcher<int>::Matcher((Matcher<int> *)&local_1cb0,0xb);
  testing::Matcher<BasicTestExpr<1>_>::Matcher
            ((Matcher<BasicTestExpr<1>_> *)&MStack_1cc8,(BasicTestExpr<1>)0x2a);
  this_20 = MockProblemBuilder::gmock_BeginNumberOf
                      (&builder.super_MockProblemBuilder,(Matcher<int> *)&local_1cb0,
                       (Matcher<BasicTestExpr<1>_> *)&MStack_1cc8);
  this_21 = testing::internal::
            MockSpec<TestExprBuilder<2,_BasicTestExpr<1>_>_(int,_BasicTestExpr<1>)>::
            InternalExpectedAt(this_20,
                               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/nl-reader-test.cc"
                               ,0x6d9,"builder","BeginNumberOf (11, TestNumericExpr(ID))");
  local_1c80.value_._0_4_ = 0x2b;
  testing::internal::ReturnAction::operator_cast_to_Action((ReturnAction *)&local_1c98);
  testing::internal::TypedExpectation<TestExprBuilder<2,_BasicTestExpr<1>_>_(int,_BasicTestExpr<1>)>
  ::WillOnce(this_21,(Action<TestExprBuilder<2,_BasicTestExpr<1>_>_(int,_BasicTestExpr<1>)> *)
                     &local_1c98);
  testing::internal::
  linked_ptr<testing::ActionInterface<TestExprBuilder<2,_BasicTestExpr<1>_>_(int,_BasicTestExpr<1>)>_>
  ::~linked_ptr((linked_ptr<testing::ActionInterface<TestExprBuilder<2,_BasicTestExpr<1>_>_(int,_BasicTestExpr<1>)>_>
                 *)&local_1c98);
  testing::internal::MatcherBase<BasicTestExpr<1>_>::~MatcherBase
            ((MatcherBase<BasicTestExpr<1>_> *)&MStack_1cc8);
  testing::internal::MatcherBase<int>::~MatcherBase((MatcherBase<int> *)&local_1cb0);
  MockProblemBuilder::BeginNumberOf(&builder.super_MockProblemBuilder,0xb,(Argument2)0x2a);
  testing::StrictMock<MockProblemBuilder>::~StrictMock(&builder);
  testing::StrictMock<MockProblemBuilder>::StrictMock(&builder);
  testing::Matcher<TestExprBuilder<2,_BasicTestExpr<1>_>_>::Matcher
            ((Matcher<TestExprBuilder<2,_BasicTestExpr<1>_>_> *)&local_1cb0,
             (TestExprBuilder<2,_BasicTestExpr<1>_>)0x2a);
  this_22 = MockProblemBuilder::gmock_EndNumberOf
                      (&builder.super_MockProblemBuilder,
                       (Matcher<TestExprBuilder<2,_BasicTestExpr<1>_>_> *)&local_1cb0);
  this_23 = testing::internal::MockSpec<BasicTestExpr<1>_(TestExprBuilder<2,_BasicTestExpr<1>_>)>::
            InternalExpectedAt(this_22,
                               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/nl-reader-test.cc"
                               ,0x6db,"builder","EndNumberOf (TestNumberOfExprBuilder(ID))");
  local_1c98._vptr_MatcherBase._0_4_ = 0x2b;
  testing::internal::ReturnAction::operator_cast_to_Action((ReturnAction *)&MStack_1cc8);
  testing::internal::TypedExpectation<BasicTestExpr<1>_(TestExprBuilder<2,_BasicTestExpr<1>_>)>::
  WillOnce(this_23,(Action<BasicTestExpr<1>_(TestExprBuilder<2,_BasicTestExpr<1>_>)> *)&MStack_1cc8)
  ;
  testing::internal::
  linked_ptr<testing::ActionInterface<BasicTestExpr<1>_(TestExprBuilder<2,_BasicTestExpr<1>_>)>_>::
  ~linked_ptr((linked_ptr<testing::ActionInterface<BasicTestExpr<1>_(TestExprBuilder<2,_BasicTestExpr<1>_>)>_>
               *)&MStack_1cc8);
  testing::internal::MatcherBase<TestExprBuilder<2,_BasicTestExpr<1>_>_>::~MatcherBase
            ((MatcherBase<TestExprBuilder<2,_BasicTestExpr<1>_>_> *)&local_1cb0);
  MockProblemBuilder::EndNumberOf(&builder.super_MockProblemBuilder,(Argument1)0x2a);
  testing::StrictMock<MockProblemBuilder>::~StrictMock(&builder);
  testing::StrictMock<MockProblemBuilder>::StrictMock(&builder);
  testing::Matcher<int>::Matcher((Matcher<int> *)&local_1cb0,0xb);
  testing::Matcher<BasicTestExpr<0>_>::Matcher
            ((Matcher<BasicTestExpr<0>_> *)&MStack_1cc8,(BasicTestExpr<0>)0x2a);
  this_24 = MockProblemBuilder::gmock_BeginSymbolicNumberOf
                      (&builder.super_MockProblemBuilder,(Matcher<int> *)&local_1cb0,
                       (Matcher<BasicTestExpr<0>_> *)&MStack_1cc8);
  this_25 = testing::internal::
            MockSpec<TestExprBuilder<0,_BasicTestExpr<0>_>_(int,_BasicTestExpr<0>)>::
            InternalExpectedAt(this_24,
                               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/nl-reader-test.cc"
                               ,0x6de,"builder","BeginSymbolicNumberOf (11, TestExpr(ID))");
  local_1c80.value_._0_4_ = 0x2b;
  testing::internal::ReturnAction::operator_cast_to_Action((ReturnAction *)&local_1c98);
  testing::internal::TypedExpectation<TestExprBuilder<0,_BasicTestExpr<0>_>_(int,_BasicTestExpr<0>)>
  ::WillOnce(this_25,(Action<TestExprBuilder<0,_BasicTestExpr<0>_>_(int,_BasicTestExpr<0>)> *)
                     &local_1c98);
  testing::internal::
  linked_ptr<testing::ActionInterface<TestExprBuilder<0,_BasicTestExpr<0>_>_(int,_BasicTestExpr<0>)>_>
  ::~linked_ptr((linked_ptr<testing::ActionInterface<TestExprBuilder<0,_BasicTestExpr<0>_>_(int,_BasicTestExpr<0>)>_>
                 *)&local_1c98);
  testing::internal::MatcherBase<BasicTestExpr<0>_>::~MatcherBase
            ((MatcherBase<BasicTestExpr<0>_> *)&MStack_1cc8);
  testing::internal::MatcherBase<int>::~MatcherBase((MatcherBase<int> *)&local_1cb0);
  MockProblemBuilder::BeginSymbolicNumberOf(&builder.super_MockProblemBuilder,0xb,(Argument2)0x2a);
  testing::StrictMock<MockProblemBuilder>::~StrictMock(&builder);
  testing::StrictMock<MockProblemBuilder>::StrictMock(&builder);
  testing::Matcher<TestExprBuilder<0,_BasicTestExpr<0>_>_>::Matcher
            ((Matcher<TestExprBuilder<0,_BasicTestExpr<0>_>_> *)&local_1cb0,
             (TestExprBuilder<0,_BasicTestExpr<0>_>)0x2a);
  this_26 = MockProblemBuilder::gmock_EndSymbolicNumberOf
                      (&builder.super_MockProblemBuilder,
                       (Matcher<TestExprBuilder<0,_BasicTestExpr<0>_>_> *)&local_1cb0);
  this_27 = testing::internal::MockSpec<BasicTestExpr<1>_(TestExprBuilder<0,_BasicTestExpr<0>_>)>::
            InternalExpectedAt(this_26,
                               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/nl-reader-test.cc"
                               ,0x6e1,"builder",
                               "EndSymbolicNumberOf (TestSymbolicNumberOfExprBuilder(ID))");
  local_1c98._vptr_MatcherBase._0_4_ = 0x2b;
  testing::internal::ReturnAction::operator_cast_to_Action((ReturnAction *)&MStack_1cc8);
  testing::internal::TypedExpectation<BasicTestExpr<1>_(TestExprBuilder<0,_BasicTestExpr<0>_>)>::
  WillOnce(this_27,(Action<BasicTestExpr<1>_(TestExprBuilder<0,_BasicTestExpr<0>_>)> *)&MStack_1cc8)
  ;
  testing::internal::
  linked_ptr<testing::ActionInterface<BasicTestExpr<1>_(TestExprBuilder<0,_BasicTestExpr<0>_>)>_>::
  ~linked_ptr((linked_ptr<testing::ActionInterface<BasicTestExpr<1>_(TestExprBuilder<0,_BasicTestExpr<0>_>)>_>
               *)&MStack_1cc8);
  testing::internal::MatcherBase<TestExprBuilder<0,_BasicTestExpr<0>_>_>::~MatcherBase
            ((MatcherBase<TestExprBuilder<0,_BasicTestExpr<0>_>_> *)&local_1cb0);
  MockProblemBuilder::EndSymbolicNumberOf(&builder.super_MockProblemBuilder,(Argument1)0x2a);
  testing::StrictMock<MockProblemBuilder>::~StrictMock(&builder);
  testing::StrictMock<MockProblemBuilder>::StrictMock(&builder);
  testing::Matcher<int>::Matcher((Matcher<int> *)&local_1cb0,99);
  this_28 = MockProblemBuilder::gmock_BeginCount
                      (&builder.super_MockProblemBuilder,(Matcher<int> *)&local_1cb0);
  this_29 = testing::internal::MockSpec<TestExprBuilder<3,_BasicTestExpr<2>_>_(int)>::
            InternalExpectedAt(this_28,
                               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/nl-reader-test.cc"
                               ,0x6e3,"builder","BeginCount (99)");
  local_1c98._vptr_MatcherBase = (_func_int **)CONCAT44(local_1c98._vptr_MatcherBase._4_4_,0x2a);
  testing::internal::ReturnAction::operator_cast_to_Action((ReturnAction *)&MStack_1cc8);
  testing::internal::TypedExpectation<TestExprBuilder<3,_BasicTestExpr<2>_>_(int)>::WillOnce
            (this_29,(Action<TestExprBuilder<3,_BasicTestExpr<2>_>_(int)> *)&MStack_1cc8);
  testing::internal::
  linked_ptr<testing::ActionInterface<TestExprBuilder<3,_BasicTestExpr<2>_>_(int)>_>::~linked_ptr
            ((linked_ptr<testing::ActionInterface<TestExprBuilder<3,_BasicTestExpr<2>_>_(int)>_> *)
             &MStack_1cc8);
  testing::internal::MatcherBase<int>::~MatcherBase((MatcherBase<int> *)&local_1cb0);
  MockProblemBuilder::BeginCount(&builder.super_MockProblemBuilder,99);
  testing::StrictMock<MockProblemBuilder>::~StrictMock(&builder);
  testing::StrictMock<MockProblemBuilder>::StrictMock(&builder);
  testing::Matcher<TestExprBuilder<3,_BasicTestExpr<2>_>_>::Matcher
            ((Matcher<TestExprBuilder<3,_BasicTestExpr<2>_>_> *)&local_1cb0,
             (TestExprBuilder<3,_BasicTestExpr<2>_>)0x2a);
  this_30 = MockProblemBuilder::gmock_EndCount
                      (&builder.super_MockProblemBuilder,
                       (Matcher<TestExprBuilder<3,_BasicTestExpr<2>_>_> *)&local_1cb0);
  this_31 = testing::internal::MockSpec<TestCountExpr_(TestExprBuilder<3,_BasicTestExpr<2>_>)>::
            InternalExpectedAt(this_30,
                               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/nl-reader-test.cc"
                               ,0x6e5,"builder","EndCount (TestCountExprBuilder(ID))");
  local_1c98._vptr_MatcherBase = (_func_int **)0x2b00000000;
  testing::internal::ReturnAction::operator_cast_to_Action((ReturnAction *)&MStack_1cc8);
  testing::internal::TypedExpectation<TestCountExpr_(TestExprBuilder<3,_BasicTestExpr<2>_>)>::
  WillOnce(this_31,(Action<TestCountExpr_(TestExprBuilder<3,_BasicTestExpr<2>_>)> *)&MStack_1cc8);
  testing::internal::
  linked_ptr<testing::ActionInterface<TestCountExpr_(TestExprBuilder<3,_BasicTestExpr<2>_>)>_>::
  ~linked_ptr((linked_ptr<testing::ActionInterface<TestCountExpr_(TestExprBuilder<3,_BasicTestExpr<2>_>)>_>
               *)&MStack_1cc8);
  testing::internal::MatcherBase<TestExprBuilder<3,_BasicTestExpr<2>_>_>::~MatcherBase
            ((MatcherBase<TestExprBuilder<3,_BasicTestExpr<2>_>_> *)&local_1cb0);
  MockProblemBuilder::EndCount(&builder.super_MockProblemBuilder,(Argument1)0x2a);
  testing::StrictMock<MockProblemBuilder>::~StrictMock(&builder);
  testing::StrictMock<MockProblemBuilder>::StrictMock(&builder);
  testing::Matcher<bool>::Matcher((Matcher<bool> *)&local_1cb0,true);
  this_32 = MockProblemBuilder::gmock_MakeLogicalConstant
                      (&builder.super_MockProblemBuilder,(Matcher<bool> *)&local_1cb0);
  this_33 = testing::internal::MockSpec<BasicTestExpr<2>_(bool)>::InternalExpectedAt
                      (this_32,
                       "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/nl-reader-test.cc"
                       ,0x6e7,"builder","MakeLogicalConstant (true)");
  local_1c98._vptr_MatcherBase._0_4_ = 0x2a;
  testing::internal::ReturnAction::operator_cast_to_Action((ReturnAction *)&MStack_1cc8);
  testing::internal::TypedExpectation<BasicTestExpr<2>_(bool)>::WillOnce
            (this_33,(Action<BasicTestExpr<2>_(bool)> *)&MStack_1cc8);
  testing::internal::linked_ptr<testing::ActionInterface<BasicTestExpr<2>_(bool)>_>::~linked_ptr
            ((linked_ptr<testing::ActionInterface<BasicTestExpr<2>_(bool)>_> *)&MStack_1cc8);
  testing::internal::MatcherBase<bool>::~MatcherBase((MatcherBase<bool> *)&local_1cb0);
  MockProblemBuilder::MakeLogicalConstant(&builder.super_MockProblemBuilder,true);
  testing::StrictMock<MockProblemBuilder>::~StrictMock(&builder);
  testing::StrictMock<MockProblemBuilder>::StrictMock(&builder);
  testing::Matcher<BasicTestExpr<2>_>::Matcher
            ((Matcher<BasicTestExpr<2>_> *)&local_1cb0,(BasicTestExpr<2>)0x2a);
  this_34 = MockProblemBuilder::gmock_MakeNot
                      (&builder.super_MockProblemBuilder,(Matcher<BasicTestExpr<2>_> *)&local_1cb0);
  this_35 = testing::internal::MockSpec<BasicTestExpr<2>_(BasicTestExpr<2>)>::InternalExpectedAt
                      (this_34,
                       "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/nl-reader-test.cc"
                       ,0x6e9,"builder","MakeNot (TestLogicalExpr(ID))");
  local_1c98._vptr_MatcherBase._0_4_ = 0x2b;
  testing::internal::ReturnAction::operator_cast_to_Action((ReturnAction *)&MStack_1cc8);
  testing::internal::TypedExpectation<BasicTestExpr<2>_(BasicTestExpr<2>)>::WillOnce
            (this_35,(Action<BasicTestExpr<2>_(BasicTestExpr<2>)> *)&MStack_1cc8);
  testing::internal::linked_ptr<testing::ActionInterface<BasicTestExpr<2>_(BasicTestExpr<2>)>_>::
  ~linked_ptr((linked_ptr<testing::ActionInterface<BasicTestExpr<2>_(BasicTestExpr<2>)>_> *)
              &MStack_1cc8);
  testing::internal::MatcherBase<BasicTestExpr<2>_>::~MatcherBase
            ((MatcherBase<BasicTestExpr<2>_> *)&local_1cb0);
  MockProblemBuilder::MakeNot(&builder.super_MockProblemBuilder,(Argument1)0x2a);
  testing::StrictMock<MockProblemBuilder>::~StrictMock(&builder);
  testing::StrictMock<MockProblemBuilder>::StrictMock(&builder);
  testing::Matcher<mp::expr::Kind>::Matcher
            ((Matcher<mp::expr::Kind> *)&local_1cb0,FIRST_BINARY_LOGICAL);
  testing::Matcher<BasicTestExpr<2>_>::Matcher
            ((Matcher<BasicTestExpr<2>_> *)&MStack_1cc8,(BasicTestExpr<2>)0x2a);
  testing::Matcher<BasicTestExpr<2>_>::Matcher
            ((Matcher<BasicTestExpr<2>_> *)&local_1c98,(BasicTestExpr<2>)0x2b);
  this_36 = MockProblemBuilder::gmock_MakeBinaryLogical
                      (&builder.super_MockProblemBuilder,(Matcher<mp::expr::Kind> *)&local_1cb0,
                       (Matcher<BasicTestExpr<2>_> *)&MStack_1cc8,
                       (Matcher<BasicTestExpr<2>_> *)&local_1c98);
  this_37 = testing::internal::
            MockSpec<BasicTestExpr<2>_(mp::expr::Kind,_BasicTestExpr<2>,_BasicTestExpr<2>)>::
            InternalExpectedAt(this_36,
                               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/nl-reader-test.cc"
                               ,0x6ec,"builder",
                               "MakeBinaryLogical (expr::OR, TestLogicalExpr(ID), TestLogicalExpr(ID2))"
                              );
  local_1c6c = 0x2c;
  testing::internal::ReturnAction::operator_cast_to_Action((ReturnAction *)&local_1c80);
  testing::internal::
  TypedExpectation<BasicTestExpr<2>_(mp::expr::Kind,_BasicTestExpr<2>,_BasicTestExpr<2>)>::WillOnce
            (this_37,(Action<BasicTestExpr<2>_(mp::expr::Kind,_BasicTestExpr<2>,_BasicTestExpr<2>)>
                      *)&local_1c80);
  testing::internal::
  linked_ptr<testing::ActionInterface<BasicTestExpr<2>_(mp::expr::Kind,_BasicTestExpr<2>,_BasicTestExpr<2>)>_>
  ::~linked_ptr((linked_ptr<testing::ActionInterface<BasicTestExpr<2>_(mp::expr::Kind,_BasicTestExpr<2>,_BasicTestExpr<2>)>_>
                 *)&local_1c80);
  testing::internal::MatcherBase<BasicTestExpr<2>_>::~MatcherBase
            ((MatcherBase<BasicTestExpr<2>_> *)&local_1c98);
  testing::internal::MatcherBase<BasicTestExpr<2>_>::~MatcherBase
            ((MatcherBase<BasicTestExpr<2>_> *)&MStack_1cc8);
  testing::internal::MatcherBase<mp::expr::Kind>::~MatcherBase
            ((MatcherBase<mp::expr::Kind> *)&local_1cb0);
  MockProblemBuilder::MakeBinaryLogical
            (&builder.super_MockProblemBuilder,FIRST_BINARY_LOGICAL,(Argument2)0x2a,(Argument3)0x2b)
  ;
  testing::StrictMock<MockProblemBuilder>::~StrictMock(&builder);
  testing::StrictMock<MockProblemBuilder>::StrictMock(&builder);
  testing::Matcher<mp::expr::Kind>::Matcher((Matcher<mp::expr::Kind> *)&local_1cb0,FIRST_RELATIONAL)
  ;
  testing::Matcher<BasicTestExpr<1>_>::Matcher
            ((Matcher<BasicTestExpr<1>_> *)&MStack_1cc8,(BasicTestExpr<1>)0x2a);
  testing::Matcher<BasicTestExpr<1>_>::Matcher
            ((Matcher<BasicTestExpr<1>_> *)&local_1c98,(BasicTestExpr<1>)0x2b);
  this_38 = MockProblemBuilder::gmock_MakeRelational
                      (&builder.super_MockProblemBuilder,(Matcher<mp::expr::Kind> *)&local_1cb0,
                       (Matcher<BasicTestExpr<1>_> *)&MStack_1cc8,
                       (Matcher<BasicTestExpr<1>_> *)&local_1c98);
  this_39 = testing::internal::
            MockSpec<BasicTestExpr<2>_(mp::expr::Kind,_BasicTestExpr<1>,_BasicTestExpr<1>)>::
            InternalExpectedAt(this_38,
                               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/nl-reader-test.cc"
                               ,0x6ef,"builder",
                               "MakeRelational (expr::LT, TestNumericExpr(ID), TestNumericExpr(ID2))"
                              );
  local_1c6c = 0x2c;
  testing::internal::ReturnAction::operator_cast_to_Action((ReturnAction *)&local_1c80);
  testing::internal::
  TypedExpectation<BasicTestExpr<2>_(mp::expr::Kind,_BasicTestExpr<1>,_BasicTestExpr<1>)>::WillOnce
            (this_39,(Action<BasicTestExpr<2>_(mp::expr::Kind,_BasicTestExpr<1>,_BasicTestExpr<1>)>
                      *)&local_1c80);
  testing::internal::
  linked_ptr<testing::ActionInterface<BasicTestExpr<2>_(mp::expr::Kind,_BasicTestExpr<1>,_BasicTestExpr<1>)>_>
  ::~linked_ptr((linked_ptr<testing::ActionInterface<BasicTestExpr<2>_(mp::expr::Kind,_BasicTestExpr<1>,_BasicTestExpr<1>)>_>
                 *)&local_1c80);
  testing::internal::MatcherBase<BasicTestExpr<1>_>::~MatcherBase
            ((MatcherBase<BasicTestExpr<1>_> *)&local_1c98);
  testing::internal::MatcherBase<BasicTestExpr<1>_>::~MatcherBase
            ((MatcherBase<BasicTestExpr<1>_> *)&MStack_1cc8);
  testing::internal::MatcherBase<mp::expr::Kind>::~MatcherBase
            ((MatcherBase<mp::expr::Kind> *)&local_1cb0);
  MockProblemBuilder::MakeRelational
            (&builder.super_MockProblemBuilder,FIRST_RELATIONAL,(Argument2)0x2a,(Argument3)0x2b);
  testing::StrictMock<MockProblemBuilder>::~StrictMock(&builder);
  testing::StrictMock<MockProblemBuilder>::StrictMock(&builder);
  testing::Matcher<mp::expr::Kind>::Matcher((Matcher<mp::expr::Kind> *)&local_1cb0,ATLEAST);
  testing::Matcher<BasicTestExpr<1>_>::Matcher
            ((Matcher<BasicTestExpr<1>_> *)&MStack_1cc8,(BasicTestExpr<1>)0x2a);
  testing::Matcher<TestCountExpr>::Matcher
            ((Matcher<TestCountExpr> *)&local_1c98,(TestCountExpr)0x2b00000000);
  this_40 = MockProblemBuilder::gmock_MakeLogicalCount
                      (&builder.super_MockProblemBuilder,(Matcher<mp::expr::Kind> *)&local_1cb0,
                       (Matcher<BasicTestExpr<1>_> *)&MStack_1cc8,
                       (Matcher<TestCountExpr> *)&local_1c98);
  this_41 = testing::internal::
            MockSpec<BasicTestExpr<2>_(mp::expr::Kind,_BasicTestExpr<1>,_TestCountExpr)>::
            InternalExpectedAt(this_40,
                               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/nl-reader-test.cc"
                               ,0x6f2,"builder",
                               "MakeLogicalCount (expr::ATLEAST, TestNumericExpr(ID), TestCountExpr(ID2))"
                              );
  local_1c6c = 0x2c;
  testing::internal::ReturnAction::operator_cast_to_Action((ReturnAction *)&local_1c80);
  testing::internal::
  TypedExpectation<BasicTestExpr<2>_(mp::expr::Kind,_BasicTestExpr<1>,_TestCountExpr)>::WillOnce
            (this_41,(Action<BasicTestExpr<2>_(mp::expr::Kind,_BasicTestExpr<1>,_TestCountExpr)> *)
                     &local_1c80);
  testing::internal::
  linked_ptr<testing::ActionInterface<BasicTestExpr<2>_(mp::expr::Kind,_BasicTestExpr<1>,_TestCountExpr)>_>
  ::~linked_ptr((linked_ptr<testing::ActionInterface<BasicTestExpr<2>_(mp::expr::Kind,_BasicTestExpr<1>,_TestCountExpr)>_>
                 *)&local_1c80);
  testing::internal::MatcherBase<TestCountExpr>::~MatcherBase
            ((MatcherBase<TestCountExpr> *)&local_1c98);
  testing::internal::MatcherBase<BasicTestExpr<1>_>::~MatcherBase
            ((MatcherBase<BasicTestExpr<1>_> *)&MStack_1cc8);
  testing::internal::MatcherBase<mp::expr::Kind>::~MatcherBase
            ((MatcherBase<mp::expr::Kind> *)&local_1cb0);
  MockProblemBuilder::MakeLogicalCount
            (&builder.super_MockProblemBuilder,ATLEAST,(Argument2)0x2a,(Argument3)0x2b00000000);
  testing::StrictMock<MockProblemBuilder>::~StrictMock(&builder);
  testing::StrictMock<MockProblemBuilder>::StrictMock(&builder);
  testing::Matcher<BasicTestExpr<2>_>::Matcher
            ((Matcher<BasicTestExpr<2>_> *)&local_1cb0,(BasicTestExpr<2>)0x2a);
  testing::Matcher<BasicTestExpr<2>_>::Matcher
            ((Matcher<BasicTestExpr<2>_> *)&MStack_1cc8,(BasicTestExpr<2>)0x2b);
  testing::Matcher<BasicTestExpr<2>_>::Matcher
            ((Matcher<BasicTestExpr<2>_> *)&local_1c98,(BasicTestExpr<2>)0x2c);
  this_42 = MockProblemBuilder::gmock_MakeImplication
                      (&builder.super_MockProblemBuilder,(Matcher<BasicTestExpr<2>_> *)&local_1cb0,
                       (Matcher<BasicTestExpr<2>_> *)&MStack_1cc8,
                       (Matcher<BasicTestExpr<2>_> *)&local_1c98);
  this_43 = testing::internal::
            MockSpec<BasicTestExpr<2>_(BasicTestExpr<2>,_BasicTestExpr<2>,_BasicTestExpr<2>)>::
            InternalExpectedAt(this_42,
                               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/nl-reader-test.cc"
                               ,0x6f5,"builder",
                               "MakeImplication (TestLogicalExpr(ID), TestLogicalExpr(ID2), TestLogicalExpr(ID3))"
                              );
  local_1c6c = 0x2d;
  testing::internal::ReturnAction::operator_cast_to_Action((ReturnAction *)&local_1c80);
  testing::internal::
  TypedExpectation<BasicTestExpr<2>_(BasicTestExpr<2>,_BasicTestExpr<2>,_BasicTestExpr<2>)>::
  WillOnce(this_43,(Action<BasicTestExpr<2>_(BasicTestExpr<2>,_BasicTestExpr<2>,_BasicTestExpr<2>)>
                    *)&local_1c80);
  testing::internal::
  linked_ptr<testing::ActionInterface<BasicTestExpr<2>_(BasicTestExpr<2>,_BasicTestExpr<2>,_BasicTestExpr<2>)>_>
  ::~linked_ptr((linked_ptr<testing::ActionInterface<BasicTestExpr<2>_(BasicTestExpr<2>,_BasicTestExpr<2>,_BasicTestExpr<2>)>_>
                 *)&local_1c80);
  testing::internal::MatcherBase<BasicTestExpr<2>_>::~MatcherBase
            ((MatcherBase<BasicTestExpr<2>_> *)&local_1c98);
  testing::internal::MatcherBase<BasicTestExpr<2>_>::~MatcherBase
            ((MatcherBase<BasicTestExpr<2>_> *)&MStack_1cc8);
  testing::internal::MatcherBase<BasicTestExpr<2>_>::~MatcherBase
            ((MatcherBase<BasicTestExpr<2>_> *)&local_1cb0);
  MockProblemBuilder::MakeImplication
            (&builder.super_MockProblemBuilder,(Argument1)0x2a,(Argument2)0x2b,(Argument3)0x2c);
  testing::StrictMock<MockProblemBuilder>::~StrictMock(&builder);
  testing::StrictMock<MockProblemBuilder>::StrictMock(&builder);
  testing::Matcher<mp::expr::Kind>::Matcher((Matcher<mp::expr::Kind> *)&local_1cb0,EXISTS);
  testing::Matcher<int>::Matcher((Matcher<int> *)&MStack_1cc8,0x16);
  this_44 = MockProblemBuilder::gmock_BeginIteratedLogical
                      (&builder.super_MockProblemBuilder,(Matcher<mp::expr::Kind> *)&local_1cb0,
                       (Matcher<int> *)&MStack_1cc8);
  this_45 = testing::internal::MockSpec<TestExprBuilder<4,_BasicTestExpr<2>_>_(mp::expr::Kind,_int)>
            ::InternalExpectedAt
                      (this_44,
                       "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/nl-reader-test.cc"
                       ,0x6f8,"builder","BeginIteratedLogical (expr::EXISTS, 22)");
  local_1c80.value_._0_4_ = 0x2a;
  testing::internal::ReturnAction::operator_cast_to_Action((ReturnAction *)&local_1c98);
  testing::internal::TypedExpectation<TestExprBuilder<4,_BasicTestExpr<2>_>_(mp::expr::Kind,_int)>::
  WillOnce(this_45,(Action<TestExprBuilder<4,_BasicTestExpr<2>_>_(mp::expr::Kind,_int)> *)
                   &local_1c98);
  testing::internal::
  linked_ptr<testing::ActionInterface<TestExprBuilder<4,_BasicTestExpr<2>_>_(mp::expr::Kind,_int)>_>
  ::~linked_ptr((linked_ptr<testing::ActionInterface<TestExprBuilder<4,_BasicTestExpr<2>_>_(mp::expr::Kind,_int)>_>
                 *)&local_1c98);
  testing::internal::MatcherBase<int>::~MatcherBase(&MStack_1cc8);
  testing::internal::MatcherBase<mp::expr::Kind>::~MatcherBase
            ((MatcherBase<mp::expr::Kind> *)&local_1cb0);
  MockProblemBuilder::BeginIteratedLogical(&builder.super_MockProblemBuilder,EXISTS,0x16);
  testing::StrictMock<MockProblemBuilder>::~StrictMock(&builder);
  testing::StrictMock<MockProblemBuilder>::StrictMock(&builder);
  testing::Matcher<TestExprBuilder<4,_BasicTestExpr<2>_>_>::Matcher
            ((Matcher<TestExprBuilder<4,_BasicTestExpr<2>_>_> *)&local_1cb0,
             (TestExprBuilder<4,_BasicTestExpr<2>_>)0x2a);
  this_46 = MockProblemBuilder::gmock_EndIteratedLogical
                      (&builder.super_MockProblemBuilder,
                       (Matcher<TestExprBuilder<4,_BasicTestExpr<2>_>_> *)&local_1cb0);
  this_47 = testing::internal::MockSpec<BasicTestExpr<2>_(TestExprBuilder<4,_BasicTestExpr<2>_>)>::
            InternalExpectedAt(this_46,
                               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/nl-reader-test.cc"
                               ,0x6fb,"builder",
                               "EndIteratedLogical (TestIteratedLogicalExprBuilder(ID))");
  local_1c98._vptr_MatcherBase._0_4_ = 0x2b;
  testing::internal::ReturnAction::operator_cast_to_Action((ReturnAction *)&MStack_1cc8);
  testing::internal::TypedExpectation<BasicTestExpr<2>_(TestExprBuilder<4,_BasicTestExpr<2>_>)>::
  WillOnce(this_47,(Action<BasicTestExpr<2>_(TestExprBuilder<4,_BasicTestExpr<2>_>)> *)&MStack_1cc8)
  ;
  testing::internal::
  linked_ptr<testing::ActionInterface<BasicTestExpr<2>_(TestExprBuilder<4,_BasicTestExpr<2>_>)>_>::
  ~linked_ptr((linked_ptr<testing::ActionInterface<BasicTestExpr<2>_(TestExprBuilder<4,_BasicTestExpr<2>_>)>_>
               *)&MStack_1cc8);
  testing::internal::MatcherBase<TestExprBuilder<4,_BasicTestExpr<2>_>_>::~MatcherBase
            ((MatcherBase<TestExprBuilder<4,_BasicTestExpr<2>_>_> *)&local_1cb0);
  MockProblemBuilder::EndIteratedLogical(&builder.super_MockProblemBuilder,(Argument1)0x2a);
  testing::StrictMock<MockProblemBuilder>::~StrictMock(&builder);
  testing::StrictMock<MockProblemBuilder>::StrictMock(&builder);
  testing::Matcher<mp::expr::Kind>::Matcher((Matcher<mp::expr::Kind> *)&local_1cb0,ALLDIFF);
  testing::Matcher<int>::Matcher((Matcher<int> *)&MStack_1cc8,0x21);
  this_48 = MockProblemBuilder::gmock_BeginPairwise
                      (&builder.super_MockProblemBuilder,(Matcher<mp::expr::Kind> *)&local_1cb0,
                       (Matcher<int> *)&MStack_1cc8);
  this_49 = testing::internal::MockSpec<TestExprBuilder<5,_BasicTestExpr<1>_>_(mp::expr::Kind,_int)>
            ::InternalExpectedAt
                      (this_48,
                       "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/nl-reader-test.cc"
                       ,0x6fe,"builder","BeginPairwise (expr::ALLDIFF, 33)");
  local_1c80.value_._0_4_ = 0x2a;
  testing::internal::ReturnAction::operator_cast_to_Action((ReturnAction *)&local_1c98);
  testing::internal::TypedExpectation<TestExprBuilder<5,_BasicTestExpr<1>_>_(mp::expr::Kind,_int)>::
  WillOnce(this_49,(Action<TestExprBuilder<5,_BasicTestExpr<1>_>_(mp::expr::Kind,_int)> *)
                   &local_1c98);
  testing::internal::
  linked_ptr<testing::ActionInterface<TestExprBuilder<5,_BasicTestExpr<1>_>_(mp::expr::Kind,_int)>_>
  ::~linked_ptr((linked_ptr<testing::ActionInterface<TestExprBuilder<5,_BasicTestExpr<1>_>_(mp::expr::Kind,_int)>_>
                 *)&local_1c98);
  testing::internal::MatcherBase<int>::~MatcherBase(&MStack_1cc8);
  testing::internal::MatcherBase<mp::expr::Kind>::~MatcherBase
            ((MatcherBase<mp::expr::Kind> *)&local_1cb0);
  MockProblemBuilder::BeginPairwise(&builder.super_MockProblemBuilder,ALLDIFF,0x21);
  testing::StrictMock<MockProblemBuilder>::~StrictMock(&builder);
  testing::StrictMock<MockProblemBuilder>::StrictMock(&builder);
  testing::Matcher<TestExprBuilder<5,_BasicTestExpr<1>_>_>::Matcher
            ((Matcher<TestExprBuilder<5,_BasicTestExpr<1>_>_> *)&local_1cb0,
             (TestExprBuilder<5,_BasicTestExpr<1>_>)0x2a);
  this_50 = MockProblemBuilder::gmock_EndPairwise
                      (&builder.super_MockProblemBuilder,
                       (Matcher<TestExprBuilder<5,_BasicTestExpr<1>_>_> *)&local_1cb0);
  this_51 = testing::internal::MockSpec<BasicTestExpr<2>_(TestExprBuilder<5,_BasicTestExpr<1>_>)>::
            InternalExpectedAt(this_50,
                               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/nl-reader-test.cc"
                               ,0x700,"builder","EndPairwise (TestPairwiseExprBuilder(ID))");
  local_1c98._vptr_MatcherBase._0_4_ = 0x2b;
  testing::internal::ReturnAction::operator_cast_to_Action((ReturnAction *)&MStack_1cc8);
  testing::internal::TypedExpectation<BasicTestExpr<2>_(TestExprBuilder<5,_BasicTestExpr<1>_>)>::
  WillOnce(this_51,(Action<BasicTestExpr<2>_(TestExprBuilder<5,_BasicTestExpr<1>_>)> *)&MStack_1cc8)
  ;
  testing::internal::
  linked_ptr<testing::ActionInterface<BasicTestExpr<2>_(TestExprBuilder<5,_BasicTestExpr<1>_>)>_>::
  ~linked_ptr((linked_ptr<testing::ActionInterface<BasicTestExpr<2>_(TestExprBuilder<5,_BasicTestExpr<1>_>)>_>
               *)&MStack_1cc8);
  testing::internal::MatcherBase<TestExprBuilder<5,_BasicTestExpr<1>_>_>::~MatcherBase
            ((MatcherBase<TestExprBuilder<5,_BasicTestExpr<1>_>_> *)&local_1cb0);
  MockProblemBuilder::EndPairwise(&builder.super_MockProblemBuilder,(Argument1)0x2a);
  testing::StrictMock<MockProblemBuilder>::~StrictMock(&builder);
  testing::StrictMock<MockProblemBuilder>::StrictMock(&builder);
  value_01.size_ = 3;
  value_01.data_ = "foo";
  testing::Matcher<fmt::BasicStringRef<char>_>::Matcher
            ((Matcher<fmt::BasicStringRef<char>_> *)&local_1cb0,value_01);
  this_52 = MockProblemBuilder::gmock_MakeStringLiteral
                      (&builder.super_MockProblemBuilder,
                       (Matcher<fmt::BasicStringRef<char>_> *)&local_1cb0);
  this_53 = testing::internal::MockSpec<BasicTestExpr<0>_(fmt::BasicStringRef<char>)>::
            InternalExpectedAt(this_52,
                               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/nl-reader-test.cc"
                               ,0x702,"builder","MakeStringLiteral (str)");
  local_1c98._vptr_MatcherBase = (_func_int **)CONCAT44(local_1c98._vptr_MatcherBase._4_4_,0x2a);
  testing::internal::ReturnAction::operator_cast_to_Action((ReturnAction *)&MStack_1cc8);
  testing::internal::TypedExpectation<BasicTestExpr<0>_(fmt::BasicStringRef<char>)>::WillOnce
            (this_53,(Action<BasicTestExpr<0>_(fmt::BasicStringRef<char>)> *)&MStack_1cc8);
  testing::internal::
  linked_ptr<testing::ActionInterface<BasicTestExpr<0>_(fmt::BasicStringRef<char>)>_>::~linked_ptr
            ((linked_ptr<testing::ActionInterface<BasicTestExpr<0>_(fmt::BasicStringRef<char>)>_> *)
             &MStack_1cc8);
  testing::internal::MatcherBase<fmt::BasicStringRef<char>_>::~MatcherBase(&local_1cb0);
  gmock_a1_01.size_ = 3;
  gmock_a1_01.data_ = "foo";
  MockProblemBuilder::MakeStringLiteral(&builder.super_MockProblemBuilder,gmock_a1_01);
  testing::StrictMock<MockProblemBuilder>::~StrictMock(&builder);
  testing::StrictMock<MockProblemBuilder>::StrictMock(&builder);
  testing::Matcher<BasicTestExpr<2>_>::Matcher
            ((Matcher<BasicTestExpr<2>_> *)&local_1cb0,(BasicTestExpr<2>)0x2a);
  testing::Matcher<BasicTestExpr<0>_>::Matcher
            ((Matcher<BasicTestExpr<0>_> *)&MStack_1cc8,(BasicTestExpr<0>)0x2b);
  testing::Matcher<BasicTestExpr<0>_>::Matcher
            ((Matcher<BasicTestExpr<0>_> *)&local_1c98,(BasicTestExpr<0>)0x2c);
  this_54 = MockProblemBuilder::gmock_MakeSymbolicIf
                      (&builder.super_MockProblemBuilder,(Matcher<BasicTestExpr<2>_> *)&local_1cb0,
                       (Matcher<BasicTestExpr<0>_> *)&MStack_1cc8,
                       (Matcher<BasicTestExpr<0>_> *)&local_1c98);
  this_55 = testing::internal::
            MockSpec<BasicTestExpr<0>_(BasicTestExpr<2>,_BasicTestExpr<0>,_BasicTestExpr<0>)>::
            InternalExpectedAt(this_54,
                               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/nl-reader-test.cc"
                               ,0x706,"builder",
                               "MakeSymbolicIf (TestLogicalExpr(ID), TestExpr(ID2), TestExpr(ID3))")
  ;
  local_1c6c = 0x2d;
  testing::internal::ReturnAction::operator_cast_to_Action((ReturnAction *)&local_1c80);
  testing::internal::
  TypedExpectation<BasicTestExpr<0>_(BasicTestExpr<2>,_BasicTestExpr<0>,_BasicTestExpr<0>)>::
  WillOnce(this_55,(Action<BasicTestExpr<0>_(BasicTestExpr<2>,_BasicTestExpr<0>,_BasicTestExpr<0>)>
                    *)&local_1c80);
  testing::internal::
  linked_ptr<testing::ActionInterface<BasicTestExpr<0>_(BasicTestExpr<2>,_BasicTestExpr<0>,_BasicTestExpr<0>)>_>
  ::~linked_ptr((linked_ptr<testing::ActionInterface<BasicTestExpr<0>_(BasicTestExpr<2>,_BasicTestExpr<0>,_BasicTestExpr<0>)>_>
                 *)&local_1c80);
  testing::internal::MatcherBase<BasicTestExpr<0>_>::~MatcherBase
            ((MatcherBase<BasicTestExpr<0>_> *)&local_1c98);
  testing::internal::MatcherBase<BasicTestExpr<0>_>::~MatcherBase
            ((MatcherBase<BasicTestExpr<0>_> *)&MStack_1cc8);
  testing::internal::MatcherBase<BasicTestExpr<2>_>::~MatcherBase
            ((MatcherBase<BasicTestExpr<2>_> *)&local_1cb0);
  MockProblemBuilder::MakeSymbolicIf
            (&builder.super_MockProblemBuilder,(Argument1)0x2a,(Argument2)0x2b,(Argument3)0x2c);
  testing::StrictMock<MockProblemBuilder>::~StrictMock(&builder);
  return;
}

Assistant:

TEST_F(NLProblemBuilderTest, Forward) {
  // Use the same StringRef object in arguments, because StringRef objects
  // are compared as pointers and string literals they point to may not
  // be merged.
  fmt::StringRef str("foo");
  EXPECT_FORWARD_RET(OnIntSuffix, AddIntSuffix, (str, mp::suf::OBJ, 11),
                     TestSuffixHandler<0>(ID));
  EXPECT_FORWARD_RET(OnDblSuffix, AddDblSuffix, (str, mp::suf::OBJ, 11),
                     TestSuffixHandler<1>(ID));

  EXPECT_FORWARD_RET(OnNumber, MakeNumericConstant,
                     (2.2), TestNumericExpr(ID));
  EXPECT_FORWARD_RET(OnVariableRef, MakeVariable, (33), TestReference(ID));
  EXPECT_FORWARD_RET(OnCommonExprRef, MakeCommonExpr, (33), TestReference(ID));
  EXPECT_FORWARD_RET(OnUnary, MakeUnary, (expr::ABS, TestNumericExpr(ID)),
                     TestNumericExpr(ID2));
  EXPECT_FORWARD_RET(OnBinary, MakeBinary,
                     (expr::ADD, TestNumericExpr(ID), TestNumericExpr(ID2)),
                     TestNumericExpr(ID3));
  EXPECT_FORWARD_RET(OnIf, MakeIf,
                     (TestLogicalExpr(ID), TestNumericExpr(ID2),
                      TestNumericExpr(ID3)), TestNumericExpr(ID4));

  EXPECT_FORWARD_RET(BeginPLTerm, BeginPLTerm, (44), TestPLTermBuilder(ID));
  EXPECT_FORWARD_RET(EndPLTerm, EndPLTerm,
                     (TestPLTermBuilder(ID), TestReference(ID2)),
                     TestNumericExpr(ID3));

  EXPECT_FORWARD_RET(BeginVarArg, BeginIterated, (expr::MAX, 77),
                     TestIteratedExprBuilder(ID));
  EXPECT_FORWARD_RET(EndVarArg, EndIterated, (TestIteratedExprBuilder(ID)),
                     TestNumericExpr(ID2));

  EXPECT_FORWARD_RET(BeginSum, BeginSum, (88),
                     TestIteratedExprBuilder(ID));
  EXPECT_FORWARD_RET(EndSum, EndSum, (TestIteratedExprBuilder(ID)),
                     TestNumericExpr(ID2));

  EXPECT_FORWARD_RET(BeginNumberOf, BeginNumberOf, (11, TestNumericExpr(ID)),
                     TestNumberOfExprBuilder(ID2));
  EXPECT_FORWARD_RET(EndNumberOf, EndNumberOf, (TestNumberOfExprBuilder(ID)),
                     TestNumericExpr(ID2));

  EXPECT_FORWARD_RET(BeginSymbolicNumberOf, BeginSymbolicNumberOf,
                     (11, TestExpr(ID)), TestSymbolicNumberOfExprBuilder(ID2));
  EXPECT_FORWARD_RET(EndSymbolicNumberOf, EndSymbolicNumberOf,
                     (TestSymbolicNumberOfExprBuilder(ID)),
                     TestNumericExpr(ID2));

  EXPECT_FORWARD_RET(BeginCount, BeginCount, (99), TestCountExprBuilder(ID));
  EXPECT_FORWARD_RET(EndCount, EndCount, (TestCountExprBuilder(ID)),
                     TestCountExpr(ID2));

  EXPECT_FORWARD_RET(OnBool, MakeLogicalConstant, (true), TestLogicalExpr(ID));
  EXPECT_FORWARD_RET(OnNot, MakeNot, (TestLogicalExpr(ID)),
                     TestLogicalExpr(ID2));
  EXPECT_FORWARD_RET(OnBinaryLogical, MakeBinaryLogical,
                     (expr::OR, TestLogicalExpr(ID), TestLogicalExpr(ID2)),
                     TestLogicalExpr(ID3));
  EXPECT_FORWARD_RET(OnRelational, MakeRelational,
                     (expr::LT, TestNumericExpr(ID), TestNumericExpr(ID2)),
                     TestLogicalExpr(ID3));
  EXPECT_FORWARD_RET(OnLogicalCount, MakeLogicalCount,
                     (expr::ATLEAST, TestNumericExpr(ID), TestCountExpr(ID2)),
                     TestLogicalExpr(ID3));
  EXPECT_FORWARD_RET(OnImplication, MakeImplication,
                     (TestLogicalExpr(ID), TestLogicalExpr(ID2),
                      TestLogicalExpr(ID3)), TestLogicalExpr(ID4));

  EXPECT_FORWARD_RET(BeginIteratedLogical, BeginIteratedLogical,
                     (expr::EXISTS, 22), TestIteratedLogicalExprBuilder(ID));
  EXPECT_FORWARD_RET(EndIteratedLogical, EndIteratedLogical,
                     (TestIteratedLogicalExprBuilder(ID)),
                     TestLogicalExpr(ID2));

  EXPECT_FORWARD_RET(BeginPairwise, BeginPairwise, (expr::ALLDIFF, 33),
                     TestPairwiseExprBuilder(ID));
  EXPECT_FORWARD_RET(EndPairwise, EndPairwise,
                     (TestPairwiseExprBuilder(ID)), TestLogicalExpr(ID2));

  EXPECT_FORWARD_RET(OnString, MakeStringLiteral, (str), TestExpr(ID));

  EXPECT_FORWARD_RET(OnSymbolicIf, MakeSymbolicIf,
                     (TestLogicalExpr(ID), TestExpr(ID2), TestExpr(ID3)),
                     TestExpr(ID4));
}